

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_sse_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  
  if ((len & 0xffffffffffffffc0) == 0) {
    auVar29 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar12 = (undefined1  [16])0x0;
    auVar13 = (undefined1  [16])0x0;
    auVar7 = (undefined1  [16])0x0;
    auVar10 = (undefined1  [16])0x0;
    auVar8 = (undefined1  [16])0x0;
    auVar9 = (undefined1  [16])0x0;
    auVar11 = (undefined1  [16])0x0;
  }
  else {
    auVar37._8_8_ = 0x5555555555555555;
    auVar37._0_8_ = 0x5555555555555555;
    auVar21._8_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar21._0_8_ = 0xaaaaaaaaaaaaaaaa;
    auVar39._8_8_ = 0x3333333333333333;
    auVar39._0_8_ = 0x3333333333333333;
    auVar40._8_8_ = 0xcccccccccccccccc;
    auVar40._0_8_ = 0xcccccccccccccccc;
    auVar41[8] = 0xf;
    auVar41._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar41[9] = 0xf;
    auVar41[10] = 0xf;
    auVar41[0xb] = 0xf;
    auVar41[0xc] = 0xf;
    auVar41[0xd] = 0xf;
    auVar41[0xe] = 0xf;
    auVar41[0xf] = 0xf;
    pauVar1 = (undefined1 (*) [16])(data + (len & 0xffffffffffffffc0));
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    do {
      iVar3 = 0x3f;
      auVar7 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar8 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar9 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar10 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar11 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
      auVar12 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar13 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar42 = ZEXT1664((undefined1  [16])0x0);
      pauVar5 = (undefined1 (*) [16])data;
      while( true ) {
        data = (uint8_t *)(pauVar5 + 4);
        auVar14 = vmovdqu64_avx512vl(pauVar5[1]);
        auVar15 = vmovdqu64_avx512vl(*pauVar5);
        auVar16 = vmovdqu64_avx512vl(pauVar5[3]);
        auVar17 = vmovdqu64_avx512vl(pauVar5[2]);
        iVar3 = iVar3 + -1;
        auVar18 = vpaddb_avx512vl(auVar14,auVar14);
        auVar14 = vpsrld_avx512vl(auVar14,1);
        auVar18 = vpternlogq_avx512vl(auVar18,auVar21,auVar15,0xe2);
        auVar14 = vpternlogq_avx512vl(auVar14,auVar37,auVar15,0xe2);
        auVar15 = vpaddb_avx512vl(auVar16,auVar16);
        auVar16 = vpsrld_avx512vl(auVar16,1);
        auVar15 = vpternlogq_avx512vl(auVar15,auVar21,auVar17,0xe2);
        auVar16 = vpternlogq_avx512vl(auVar16,auVar37,auVar17,0xe2);
        auVar17 = vpslld_avx512vl(auVar15,2);
        auVar19 = vpslld_avx512vl(auVar16,2);
        auVar16 = vpsrld_avx512vl(auVar16,2);
        auVar15 = vpsrld_avx512vl(auVar15,2);
        auVar17 = vpternlogq_avx512vl(auVar17,auVar40,auVar18,0xe2);
        auVar19 = vpternlogq_avx512vl(auVar19,auVar40,auVar14,0xe2);
        auVar14 = vpternlogq_avx512vl(auVar16,auVar39,auVar14,0xe2);
        auVar15 = vpternlogq_avx512vl(auVar15,auVar39,auVar18,0xe2);
        auVar16 = vpandq_avx512vl(auVar17,auVar41);
        auVar16 = vpshufb_avx512vl(_DAT_0011a1c0,auVar16);
        auVar7 = vpaddb_avx512vl(auVar16,auVar7);
        auVar16 = vpsrld_avx512vl(auVar17,4);
        auVar16 = vpandq_avx512vl(auVar16,auVar41);
        auVar16 = vpshufb_avx512vl(_DAT_0011a1c0,auVar16);
        auVar11 = vpaddb_avx512vl(auVar16,auVar11);
        auVar16 = vpandq_avx512vl(auVar19,auVar41);
        auVar16 = vpshufb_avx512vl(_DAT_0011a1c0,auVar16);
        auVar8 = vpaddb_avx512vl(auVar16,auVar8);
        auVar16 = vpsrld_avx512vl(auVar19,4);
        auVar16 = vpandq_avx512vl(auVar16,auVar41);
        auVar16 = vpshufb_avx512vl(_DAT_0011a1c0,auVar16);
        auVar12 = vpaddb_avx512vl(auVar16,auVar12);
        auVar16 = vpandq_avx512vl(auVar15,auVar41);
        auVar15 = vpsrld_avx512vl(auVar15,4);
        auVar15 = vpandq_avx512vl(auVar15,auVar41);
        auVar16 = vpshufb_avx512vl(_DAT_0011a1c0,auVar16);
        auVar15 = vpshufb_avx512vl(_DAT_0011a1c0,auVar15);
        auVar9 = vpaddb_avx512vl(auVar16,auVar9);
        auVar13 = vpaddb_avx512vl(auVar15,auVar13);
        auVar15 = vpandq_avx512vl(auVar14,auVar41);
        auVar15 = vpshufb_avx512vl(_DAT_0011a1c0,auVar15);
        auVar10 = vpaddb_avx512vl(auVar15,auVar10);
        auVar14 = vpsrld_avx512vl(auVar14,4);
        auVar14 = vpandq_avx512vl(auVar14,auVar41);
        auVar14 = vpshufb_avx512vl(_DAT_0011a1c0,auVar14);
        auVar14 = vpaddb_avx512vl(auVar14,auVar42._0_16_);
        auVar42 = ZEXT1664(auVar14);
        if (iVar3 == 0) break;
        pauVar6 = pauVar5 + 4;
        pauVar5 = (undefined1 (*) [16])data;
        if (pauVar6 == pauVar1) {
          auVar8 = vpsadbw_avx512vl(auVar8,(undefined1  [16])0x0);
          auVar37 = vpsadbw_avx512vl(auVar9,(undefined1  [16])0x0);
          auVar7 = vpsadbw_avx512vl(auVar7,(undefined1  [16])0x0);
          auVar9 = vpaddq_avx(auVar8,auVar34._0_16_);
          auVar8 = vpaddq_avx(auVar37,auVar33._0_16_);
          auVar10 = vpsadbw_avx512vl(auVar10,(undefined1  [16])0x0);
          auVar37 = vpsadbw_avx512vl(auVar11,(undefined1  [16])0x0);
          auVar11 = vpaddq_avx(auVar7,auVar35._0_16_);
          auVar10 = vpaddq_avx(auVar10,auVar30._0_16_);
          auVar7 = vpaddq_avx(auVar37,auVar27._0_16_);
          auVar12 = vpsadbw_avx512vl(auVar12,(undefined1  [16])0x0);
          auVar21 = vpsadbw_avx512vl(auVar13,(undefined1  [16])0x0);
          auVar37 = vpsadbw_avx(auVar14,(undefined1  [16])0x0);
          auVar13 = vpaddq_avx(auVar12,auVar26._0_16_);
          auVar12 = vpaddq_avx(auVar21,auVar25._0_16_);
          auVar14 = vpaddq_avx(auVar37,auVar23._0_16_);
          goto LAB_001129d9;
        }
      }
      auVar7 = vpsadbw_avx512vl(auVar7,(undefined1  [16])0x0);
      in_ZMM22 = ZEXT1664(auVar7);
      auVar8 = vpsadbw_avx512vl(auVar8,(undefined1  [16])0x0);
      in_ZMM21 = ZEXT1664(auVar8);
      auVar15 = vpsadbw_avx512vl(auVar9,(undefined1  [16])0x0);
      in_ZMM20 = ZEXT1664(auVar15);
      auVar10 = vpsadbw_avx512vl(auVar10,(undefined1  [16])0x0);
      in_ZMM19 = ZEXT1664(auVar10);
      auVar16 = vpsadbw_avx512vl(auVar11,(undefined1  [16])0x0);
      in_ZMM18 = ZEXT1664(auVar16);
      auVar12 = vpsadbw_avx512vl(auVar12,(undefined1  [16])0x0);
      in_ZMM17 = ZEXT1664(auVar12);
      auVar17 = vpsadbw_avx512vl(auVar13,(undefined1  [16])0x0);
      in_ZMM16 = ZEXT1664(auVar17);
      auVar14 = vpsadbw_avx(auVar14,(undefined1  [16])0x0);
      auVar11 = vpaddq_avx512vl(auVar7,auVar35._0_16_);
      auVar35 = ZEXT1664(auVar11);
      auVar9 = vpaddq_avx512vl(auVar8,auVar34._0_16_);
      auVar34 = ZEXT1664(auVar9);
      auVar8 = vpaddq_avx512vl(auVar15,auVar33._0_16_);
      auVar33 = ZEXT1664(auVar8);
      auVar10 = vpaddq_avx512vl(auVar10,auVar30._0_16_);
      auVar30 = ZEXT1664(auVar10);
      auVar7 = vpaddq_avx512vl(auVar16,auVar27._0_16_);
      auVar27 = ZEXT1664(auVar7);
      auVar13 = vpaddq_avx512vl(auVar12,auVar26._0_16_);
      auVar26 = ZEXT1664(auVar13);
      auVar12 = vpaddq_avx512vl(auVar17,auVar25._0_16_);
      auVar25 = ZEXT1664(auVar12);
      auVar14 = vpaddq_avx(auVar14,auVar23._0_16_);
      auVar23 = ZEXT1664(auVar14);
    } while ((undefined1 (*) [16])data != pauVar1);
LAB_001129d9:
    auVar29 = ZEXT1632(auVar14);
    data = (uint8_t *)pauVar1;
  }
  auVar37 = vpunpcklqdq_avx(auVar11,auVar9);
  auVar11 = vpunpckhqdq_avx(auVar11,auVar9);
  uVar20 = auVar10._0_8_;
  auVar38._8_8_ = uVar20;
  auVar38._0_8_ = uVar20;
  auVar38._16_8_ = uVar20;
  auVar38._24_8_ = uVar20;
  auVar21 = auVar29._0_16_;
  auVar28._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar21;
  auVar28._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar10;
  auVar36._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar37;
  auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  auVar9 = vpshufd_avx(auVar8,0xee);
  auVar31._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar11;
  auVar31._16_16_ = ZEXT116(1) * auVar9;
  auVar24 = vpblendd_avx2(auVar36,auVar38,0xc0);
  auVar28 = vpblendd_avx2(auVar31,auVar28,0xc0);
  uVar20 = auVar29._0_8_;
  auVar32._8_8_ = uVar20;
  auVar32._0_8_ = uVar20;
  auVar32._16_8_ = uVar20;
  auVar32._24_8_ = uVar20;
  auVar22._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar21;
  auVar22._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar21;
  auVar29 = vpaddq_avx2(auVar24,auVar28);
  auVar9 = vpmovqd_avx512vl(auVar29);
  auVar9 = vpaddd_avx(auVar9,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar9;
  auVar9 = vpunpcklqdq_avx(auVar7,auVar13);
  auVar8 = vpunpckhqdq_avx(auVar7,auVar13);
  auVar29._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar9;
  auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
  auVar9 = vpshufd_avx(auVar12,0xee);
  auVar24._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar8;
  auVar24._16_16_ = ZEXT116(1) * auVar9;
  auVar29 = vpblendd_avx2(auVar29,auVar32,0xc0);
  auVar24 = vpblendd_avx2(auVar24,auVar22,0xc0);
  auVar29 = vpaddq_avx2(auVar29,auVar24);
  auVar9 = vpmovqd_avx512vl(auVar29);
  auVar9 = vpaddd_avx(auVar9,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar9;
  if ((len & 0x3f) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] +
             (uint)(((byte)(*(undefined1 (*) [16])data)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0x3f));
  }
  return;
}

Assistant:

void pospopcnt_u8_sse_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    const __m128i popcnt_4bit = _mm_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m128i lo_nibble = _mm_set1_epi8(0x0f);

    int local = 0;
    __m128i counter8bit_a = zero;
    __m128i counter8bit_b = zero;
    __m128i counter8bit_c = zero;
    __m128i counter8bit_d = zero;
    __m128i counter8bit_e = zero;
    __m128i counter8bit_f = zero;
    __m128i counter8bit_g = zero;
    __m128i counter8bit_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m128i s0 = sse4_merge1_even(r0, r1);
        const __m128i s1 = sse4_merge1_odd (r0, r1);
        const __m128i s2 = sse4_merge1_even(r2, r3);
        const __m128i s3 = sse4_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m128i d0 = sse4_merge2_even(s0, s2);
        const __m128i d1 = sse4_merge2_even(s1, s3);
        const __m128i d2 = sse4_merge2_odd (s0, s2);
        const __m128i d3 = sse4_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i popcnt_a = _mm_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m128i popcnt_e = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d0, 4) & lo_nibble);
        const __m128i popcnt_b = _mm_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m128i popcnt_f = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d1, 4) & lo_nibble);
        const __m128i popcnt_c = _mm_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m128i popcnt_g = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d2, 4) & lo_nibble);
        const __m128i popcnt_d = _mm_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m128i popcnt_h = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm_setzero_si128();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_b);
    flag_counts[2] += sse4_sum_epu64(counter_c);
    flag_counts[3] += sse4_sum_epu64(counter_d);
    flag_counts[4] += sse4_sum_epu64(counter_e);
    flag_counts[5] += sse4_sum_epu64(counter_f);
    flag_counts[6] += sse4_sum_epu64(counter_g);
    flag_counts[7] += sse4_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}